

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderProgramResourceTest::checkIfResourceIsReferenced
          (GeometryShaderProgramResourceTest *this,GLuint program_object_id,GLenum interface,
          char *name)

{
  int iVar1;
  GLuint index_00;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLuint index;
  Functions *gl;
  char *name_local;
  GLenum interface_local;
  GLuint program_object_id_local;
  GeometryShaderProgramResourceTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  index_00 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x9a8))(program_object_id,interface,name);
  if (index_00 == 0xffffffff) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = checkIfResourceAtIndexIsReferenced(this,program_object_id,interface,index_00)
    ;
  }
  return this_local._7_1_;
}

Assistant:

bool GeometryShaderProgramResourceTest::checkIfResourceIsReferenced(glw::GLuint program_object_id,
																	glw::GLenum interface, const char* name) const
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Resource index */
	glw::GLuint index = GL_INVALID_INDEX;

	/* Get resource's index by name */
	index = gl.getProgramResourceIndex(program_object_id, interface, name);

	/**
	 *     Otherwise, <name> is considered not to be the name
	 *     of an active resource, and INVALID_INDEX is returned.
	 **/
	if (GL_INVALID_INDEX == index)
	{
		return false;
	}

	/* Get property by index */
	return checkIfResourceAtIndexIsReferenced(program_object_id, interface, index);
}